

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O0

row_iterator * __thiscall sqlite::row_iterator::operator++(row_iterator *this)

{
  pointer psVar1;
  char *in_RCX;
  str_ref sql;
  string local_58;
  undefined1 local_38 [16];
  value_type local_28;
  int local_14;
  row_iterator *prStack_10;
  int result;
  row_iterator *this_local;
  
  prStack_10 = this;
  psVar1 = std::unique_ptr<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>::get(&this->_binder->_stmt);
  local_14 = sqlite3_step(psVar1);
  if (local_14 == 100) {
    value_type::value_type(&local_28,this->_binder);
    (this->value)._binder = local_28._binder;
    (this->value).next_index = local_28.next_index;
  }
  else if (local_14 == 0x65) {
    this->_binder = (database_binder *)0x0;
  }
  else {
    database_binder::sql_abi_cxx11_(&local_58,this->_binder);
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    sql._M_len = local_38._8_8_;
    sql._M_str = in_RCX;
    errors::throw_sqlite_error((errors *)&local_14,local_38._0_8_,sql);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return this;
}

Assistant:

row_iterator &operator++() {
			switch(int result = sqlite3_step(_binder->_stmt.get())) {
				case SQLITE_ROW:
					value = {_binder};
					break;
				case SQLITE_DONE:
					_binder = nullptr;
					break;
				default:
					exceptions::throw_sqlite_error(result, _binder->sql());
			}
			return *this;
		}